

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O1

void cf_blockwise_xor(uint8_t *partial,size_t *npartial,size_t nblock,void *inp,void *outp,
                     size_t nbytes,cf_blockwise_out_fn process,void *ctx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((((partial != (uint8_t *)0x0) && (*npartial < nblock)) && (nbytes == 0 || inp != (void *)0x0))
     && ((process != (cf_blockwise_out_fn)0x0 && (ctx != (void *)0x0)))) {
    if (nbytes != 0) {
      do {
        if (*npartial == 0) {
          (*process)(ctx,partial);
          *npartial = nblock;
        }
        uVar1 = *npartial;
        uVar2 = nbytes;
        if (uVar1 < nbytes) {
          uVar2 = uVar1;
        }
        if (uVar1 != 0) {
          uVar3 = 0;
          do {
            *(byte *)((long)outp + uVar3) =
                 partial[uVar3 + (nblock - uVar1)] ^ *(byte *)((long)inp + uVar3);
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        *npartial = *npartial - uVar2;
        outp = (void *)((long)outp + uVar2);
        inp = (void *)((long)inp + uVar2);
        nbytes = nbytes - uVar2;
      } while (nbytes != 0);
    }
    return;
  }
  abort();
}

Assistant:

void cf_blockwise_xor(uint8_t *partial, size_t *npartial, size_t nblock,
                      const void *inp, void *outp, size_t nbytes,
                      cf_blockwise_out_fn process, void *ctx)
{
  const uint8_t *inb = inp;
  uint8_t *outb = outp;

  assert(partial && *npartial < nblock);
  assert(inp || !nbytes);
  assert(process && ctx);

  while (nbytes)
  {
    /* If we're out of material, and need more, produce a block. */
    if (*npartial == 0)
    {
      process(ctx, partial);
      *npartial = nblock;
    }

    size_t offset = nblock - *npartial;
    size_t taken = MIN(*npartial, nbytes);
    xor_bb(outb, inb, partial + offset, taken);
    *npartial -= taken;
    nbytes -= taken;
    outb += taken;
    inb += taken;
  }
}